

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall ycqian::thread_pool::execute(thread_pool *this,function<void_()> *f)

{
  element_type *peVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lg;
  function<void_()> *f_local;
  thread_pool *this_local;
  
  lg._M_device = (mutex_type *)f;
  peVar1 = std::
           __shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&peVar1->mutex);
  peVar1 = std::
           __shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push(&peVar1->tasks,(value_type *)lg._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  std::__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void execute(std::function<void()> &&f) {
            {
                std::lock_guard<std::mutex> lg(data_->mutex);
                data_->tasks.push(f);
            }
            data_->cv.notify_one();
        }